

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O1

void TTD::NSLogEvents::JsRTRawBufferModifyAction_Parse<(TTD::NSLogEvents::EventKind)65>
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  EventKind EVar1;
  uint32 uVar2;
  int iVar3;
  TTDVar pvVar4;
  uchar *puVar5;
  ulong uVar6;
  
  if (evt->EventKind == RawBufferAsyncModifyComplete) {
    (*reader->_vptr_FileReader[3])(reader,0x12,1);
    puVar5 = (uchar *)0x0;
    pvVar4 = NSSnapValues::ParseTTDVar(false,reader);
    *(TTDVar *)(evt + 1) = pvVar4;
    EVar1 = FileReader::ReadUInt32(reader,index,true);
    evt[2].EventKind = EVar1;
    uVar2 = FileReader::ReadUInt32(reader,count,true);
    evt[2].ResultStatus = uVar2;
    if (uVar2 != 0) {
      puVar5 = SlabAllocatorBase<8>::SlabAllocateArray<unsigned_char>(alloc,(ulong)uVar2);
    }
    evt[1].EventTimeStamp = (int64)puVar5;
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    if (evt[2].ResultStatus != 0) {
      uVar6 = 0;
      do {
        iVar3 = (*reader->_vptr_FileReader[9])(reader,(ulong)(uVar6 != 0));
        *(char *)(evt[1].EventTimeStamp + uVar6) = (char)iVar3;
        uVar6 = uVar6 + 1;
      } while (uVar6 < (uint)evt[2].ResultStatus);
    }
    (*reader->_vptr_FileReader[5])(reader);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void JsRTRawBufferModifyAction_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTRawBufferModifyAction* bufferAction = GetInlineEventDataAs<JsRTRawBufferModifyAction, tag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            bufferAction->Trgt = NSSnapValues::ParseTTDVar(false, reader);

            bufferAction->Index = reader->ReadUInt32(NSTokens::Key::index, true);
            bufferAction->Length = reader->ReadUInt32(NSTokens::Key::count, true);

            bufferAction->Data = (bufferAction->Length != 0) ? alloc.SlabAllocateArray<byte>(bufferAction->Length) : nullptr;

            reader->ReadSequenceStart_WDefaultKey(true);
            for(uint32 i = 0; i < bufferAction->Length; ++i)
            {
                bufferAction->Data[i] = reader->ReadNakedByte(i != 0);
            }
            reader->ReadSequenceEnd();
        }